

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  uint64_t *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  vec<unsigned_int> *pvVar5;
  int j;
  int iVar6;
  long lVar7;
  long lVar8;
  CRef cr;
  uint local_44;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *local_40;
  long local_38;
  
  if (this->use_simplification == true) {
    local_40 = &this->occurs;
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::cleanAll
              (local_40);
    iVar6 = (this->super_Solver).vardata.sz;
    if (iVar6 <= (this->occurs).occs.sz) {
      lVar4 = 0;
      while (lVar4 < iVar6) {
        pvVar5 = (local_40->occs).data + lVar4;
        lVar8 = 0;
        local_38 = lVar4;
        for (lVar7 = 0; lVar4 = (long)pvVar5->sz, lVar7 < lVar4; lVar7 = lVar7 + 1) {
          ClauseAllocator::reloc(&(this->super_Solver).ca,(CRef *)((long)pvVar5->data + lVar8),to);
          lVar8 = lVar8 + 4;
        }
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + lVar4;
        iVar6 = (this->super_Solver).vardata.sz;
        lVar4 = local_38 + 1;
      }
    }
    iVar3 = (this->subsumption_queue).end;
    iVar6 = 0;
    iVar2 = (this->subsumption_queue).first;
    if (iVar3 < iVar2) {
      iVar6 = (this->subsumption_queue).buf.sz;
    }
    this_00 = &(this->super_Solver).ca;
    for (iVar6 = (iVar3 - iVar2) + iVar6; 0 < iVar6; iVar6 = iVar6 + -1) {
      iVar3 = (this->subsumption_queue).first;
      local_44 = (this->subsumption_queue).buf.data[iVar3];
      iVar3 = iVar3 + 1;
      if (iVar3 == (this->subsumption_queue).buf.sz) {
        iVar3 = 0;
      }
      (this->subsumption_queue).first = iVar3;
      puVar1 = &(this->super_Solver).statistics.simpSteps;
      *puVar1 = *puVar1 + 1;
      if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[local_44] & 3) == 0) {
        ClauseAllocator::reloc(this_00,&local_44,to);
        Queue<unsigned_int>::insert(&this->subsumption_queue,local_44);
      }
    }
    ClauseAllocator::reloc(this_00,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator &to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    occurs.cleanAll();
    if (occurs.size() >= nVars()) {
        for (int i = 0; i < nVars(); i++) {
            vec<CRef> &cs = occurs[i];
            assert((solves == 0 || cs.size() == 0) && "There should be no occurrences during solving");
            for (int j = 0; j < cs.size(); j++) ca.reloc(cs[j], to);
            statistics.simpSteps += cs.size();
        }
    }

    // Subsumption queue:
    //
    assert((solves == 0 || subsumption_queue.size() == 0) &&
           "There should be no occurrences subsumption candidates during solving");
    for (int i = subsumption_queue.size(); i > 0; i--) {
        CRef cr = subsumption_queue.peek();
        subsumption_queue.pop();
        statistics.simpSteps++;
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}